

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

void pnga_set_property(Integer g_a,char *property)

{
  long lVar1;
  short sVar2;
  uint dev_flag;
  char **ppcVar3;
  bool bVar4;
  global_array_t *pgVar5;
  global_array_t *pgVar6;
  int iVar7;
  long lVar8;
  Integer *pIVar9;
  Integer IVar10;
  logical lVar11;
  Integer IVar12;
  Integer IVar13;
  long lVar14;
  C_Integer *pCVar15;
  Integer type;
  int iVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  Integer status;
  Integer local_200;
  long local_1f8;
  Integer local_1f0;
  Integer dims [7];
  Integer blk [7];
  Integer pe [7];
  Integer hi [7];
  Integer chunk [7];
  Integer lo [7];
  Integer ld [7];
  
  lVar1 = g_a + 1000;
  bVar4 = true;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  pnga_pgroup_sync((long)GA[lVar1].p_handle);
  if (GA[lVar1].property != 0) {
    pnga_error("Cannot set property on an array that already has property set",0);
  }
  iVar7 = strcmp(property,"read_only");
  if (iVar7 != 0) {
    iVar7 = strcmp(property,"read_cache");
    pgVar5 = GA;
    if (iVar7 == 0) {
      GA[lVar1].property = 2;
      pgVar5[lVar1].cache_head = (cache_struct_t *)0x0;
      return;
    }
    pnga_error("Trying to set unknown property",0);
    return;
  }
  if (GA[lVar1].distr_type != 0) {
    pnga_error("Block-cyclic arrays not supported for READ_ONLY",0);
  }
  if (GA[lVar1].p_handle != -1) {
    pnga_error("Arrays on subgroups not supported for READ_ONLY",0);
  }
  pgVar5 = GA;
  sVar2 = GA[lVar1].ndim;
  local_1f8 = (long)sVar2;
  lVar8 = 0;
  iVar7 = 0;
  if (0 < sVar2) {
    iVar7 = (int)sVar2;
  }
  lVar22 = (long)iVar7;
  iVar7 = 0;
  for (; lVar22 != lVar8; lVar8 = lVar8 + 1) {
    iVar16 = pgVar5[g_a + 1000].nblock[lVar8];
    pgVar5[g_a + 1000].old_nblock[lVar8] = iVar16;
    pgVar5[g_a + 1000].old_lo[lVar8] = (int)pgVar5[g_a + 1000].lo[lVar8];
    pgVar5[g_a + 1000].old_chunk[lVar8] = (int)pgVar5[g_a + 1000].chunk[lVar8];
    iVar7 = iVar7 + iVar16;
  }
  local_200 = g_a;
  pIVar9 = (Integer *)malloc((long)iVar7 * 8 + 8);
  IVar12 = local_200;
  pgVar5[lVar1].old_mapc = pIVar9;
  pgVar5 = GA;
  for (lVar8 = 0; lVar8 <= iVar7; lVar8 = lVar8 + 1) {
    pgVar5[lVar1].old_mapc[lVar8] = pgVar5[lVar1].mapc[lVar8];
  }
  IVar10 = pnga_create_handle();
  pnga_set_data(IVar10,local_1f8,GA[lVar1].dims,(long)GA[lVar1].type);
  pnga_set_pgroup(IVar10,(long)GA[lVar1].p_handle);
  lVar11 = pnga_allocate(IVar10);
  if (lVar11 == 0) {
    pnga_error("Failed to allocate temporary array",0);
  }
  local_1f0 = IVar10;
  pnga_copy(IVar12,IVar10);
  GA[lVar1].old_handle = GA[lVar1].p_handle;
  lVar8 = 0;
  IVar12 = pnga_cluster_nodeid();
  IVar10 = pnga_cluster_nprocs(IVar12);
  IVar13 = pnga_cluster_procid(IVar12,0);
  pnga_pgroup_set_default(-1);
  pIVar9 = (Integer *)malloc(IVar10 * 8);
  IVar12 = IVar10;
  if (IVar10 < 1) {
    IVar12 = lVar8;
  }
  for (; IVar12 != lVar8; lVar8 = lVar8 + 1) {
    pIVar9[lVar8] = lVar8 + IVar13;
  }
  IVar12 = pnga_pgroup_create(pIVar9,IVar10);
  free(pIVar9);
  pgVar5 = GA;
  iVar7 = (int)IVar12;
  GA[lVar1].p_handle = iVar7;
  pgVar5[lVar1].property = 1;
  for (lVar8 = 0; lVar22 != lVar8; lVar8 = lVar8 + 1) {
    lVar17 = pgVar5[lVar1].dims[lVar8];
    lVar18 = pgVar5[lVar1].chunk[lVar8];
    if (pgVar5[lVar1].chunk[lVar8] != lVar17) {
      lVar18 = -1;
    }
    chunk[lVar8] = lVar18;
    dims[lVar8] = lVar17;
  }
  if (chunk[0] == 0) {
    for (lVar8 = 0; lVar22 != lVar8; lVar8 = lVar8 + 1) {
      blk[lVar8] = -1;
    }
  }
  else {
    for (lVar8 = 0; lVar22 != lVar8; lVar8 = lVar8 + 1) {
      lVar17 = dims[lVar8];
      if (chunk[lVar8] < dims[lVar8]) {
        lVar17 = chunk[lVar8];
      }
      blk[lVar8] = lVar17;
    }
  }
  for (lVar8 = 0; lVar22 != lVar8; lVar8 = lVar8 + 1) {
    if (dims[lVar8] == 1) {
      blk[lVar8] = 1;
    }
  }
  ddb_h2(local_1f8,dims,(long)PGRP_LIST[IVar12].map_nproc,0.0,0,blk,pe);
  lVar8 = 1;
  pIVar9 = mapALL;
  for (lVar17 = 0; pgVar5 = GA, lVar17 != lVar22; lVar17 = lVar17 + 1) {
    lVar18 = chunk[lVar17];
    lVar19 = dims[lVar17];
    if (lVar18 < 2) {
      IVar10 = pe[lVar17];
      lVar19 = lVar19 - (blk[lVar17] + -1) * IVar10;
    }
    else {
      lVar14 = lVar19;
      if (lVar18 < lVar19) {
        lVar14 = lVar18;
      }
      IVar10 = pe[lVar17];
      lVar19 = (lVar19 + -1) / lVar14 + (1 - blk[lVar17]) * IVar10 + 1;
    }
    lVar14 = 0;
    for (iVar16 = 0; (lVar14 < IVar10 && ((long)iVar16 < dims[lVar17])); iVar16 = iVar16 + iVar20) {
      iVar20 = (int)blk[lVar17] - (uint)(lVar19 <= lVar14);
      pIVar9[lVar14] = (long)(iVar16 + 1);
      if (1 < lVar18) {
        lVar21 = dims[lVar17];
        if (lVar18 < dims[lVar17]) {
          lVar21 = lVar18;
        }
        iVar20 = iVar20 * (int)lVar21;
      }
      lVar14 = lVar14 + 1;
      IVar10 = pe[lVar17];
    }
    if (IVar10 < lVar14) {
      lVar14 = IVar10;
    }
    pe[lVar17] = lVar14;
    pIVar9 = pIVar9 + lVar14;
  }
  lVar18 = 0;
  for (lVar17 = 0; lVar22 != lVar17; lVar17 = lVar17 + 1) {
    lVar19 = pe[lVar17];
    pgVar5[g_a + 1000].nblock[lVar17] = (int)lVar19;
    lVar18 = lVar18 + lVar19;
  }
  free(GA[lVar1].mapc);
  pCVar15 = (C_Integer *)malloc(lVar18 * 8 + 8);
  GA[lVar1].mapc = pCVar15;
  pIVar9 = mapALL;
  pgVar5 = GA + lVar1;
  lVar19 = 0;
  lVar17 = 0;
  if (0 < lVar18) {
    lVar17 = lVar18;
  }
  for (; pgVar6 = GA, lVar17 != lVar19; lVar19 = lVar19 + 1) {
    pgVar5->mapc[lVar19] = pIVar9[lVar19];
  }
  GA[lVar1].mapc[lVar18] = -1;
  for (lVar17 = 0; lVar22 != lVar17; lVar17 = lVar17 + 1) {
    pgVar6[g_a + 1000].scale[lVar17] =
         (double)pgVar6[g_a + 1000].nblock[lVar17] / (double)pgVar6[g_a + 1000].dims[lVar17];
  }
  pnga_distribution(local_200,GAme,pgVar6[lVar1].lo,hi);
  pgVar5 = GA;
  for (lVar17 = 0; lVar22 != lVar17; lVar17 = lVar17 + 1) {
    if (hi[lVar17] < GA[g_a + 1000].lo[lVar17]) {
      bVar4 = false;
    }
    lVar8 = lVar8 * ((hi[lVar17] - GA[g_a + 1000].lo[lVar17]) + 1);
  }
  lVar17 = 0;
  if (bVar4) {
    lVar17 = lVar8 * GA[lVar1].elemsize;
  }
  IVar10 = pnga_pgroup_nodeid(IVar12);
  lVar8 = (long)pgVar5[lVar1].old_handle;
  ppcVar3 = pgVar5[lVar1].ptr;
  if (lVar8 < 1) {
    IVar13 = pnga_pgroup_nodeid(lVar8);
    ARMCI_Free(ppcVar3[IVar13] + -pgVar5[lVar1].id);
  }
  else {
    IVar13 = pnga_pgroup_nodeid(lVar8);
    ARMCI_Free_group(ppcVar3[IVar13] + -pgVar5[lVar1].id,&PGRP_LIST[lVar8].group);
  }
  IVar13 = local_200;
  lVar8 = GA[lVar1].size;
  if (GA_memory_limited == '\0') {
    GAstat.curmem = (GAstat.curmem - lVar8) + lVar17;
    status = 1;
  }
  else {
    GA_total_memory = (GA_total_memory + lVar8) - lVar17;
    GAstat.curmem = (GAstat.curmem - lVar8) + lVar17;
    status = (ulong)~GA_total_memory >> 0x3f;
    type = pnga_type_f2c(0x3f2);
    pnga_pgroup_gop(IVar12,type,&status,1,"&&");
    if (status == 0) {
      GA[lVar1].ptr[IVar10] = (char *)0x0;
      goto LAB_001756df;
    }
  }
  dev_flag = GA[lVar1].mem_dev_set;
  if (dev_flag == 0) {
    iVar7 = gai_get_shmem(GA[lVar1].ptr,lVar17,GA[lVar1].type,&GA[lVar1].id,iVar7);
  }
  else {
    iVar7 = gai_get_devmem((char *)(ulong)dev_flag,GA[lVar1].ptr,lVar17,GA[lVar1].type,&GA[lVar1].id
                           ,iVar7,dev_flag,GA[lVar1].mem_dev);
  }
  status = (Integer)(iVar7 == 0);
LAB_001756df:
  GA[lVar1].size = lVar17;
  if (status == 0) {
    pnga_error("Memory failure when unsetting READ_ONLY",0);
  }
  pnga_distribution(IVar13,GAme,lo,hi);
  IVar12 = local_1f0;
  bVar4 = true;
  for (lVar8 = 0; lVar22 != lVar8; lVar8 = lVar8 + 1) {
    ld[lVar8] = (hi[lVar8] - lo[lVar8]) + 1;
    if (hi[lVar8] < lo[lVar8]) {
      bVar4 = false;
    }
  }
  if (bVar4) {
    pnga_get(local_1f0,lo,hi,GA[lVar1].ptr[IVar10],ld);
  }
  pnga_destroy(IVar12);
  return;
}

Assistant:

void pnga_set_property(Integer g_a, char* property) {
  Integer ga_handle = g_a + GA_OFFSET;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous sync masking*/
  pnga_pgroup_sync(GA[ga_handle].p_handle);
  /* Check to see if property conflicts with properties already set on the
   * global array. This check may need more refinement as additional properties
   * are added. */
  if (GA[ga_handle].property != NO_PROPERTY) {
    pnga_error("Cannot set property on an array that already has property set",0);
  }
  if (strcmp(property,"read_only")==0) {
    /* TODO: copy global array to new configuration */
    int i, d, ndim, btot, chk;
    Integer nprocs, nodeid, origin_id, dflt_grp, handle, maplen;
    Integer nelem, mem_size, status, grp_me, g_tmp, me_local;
    Integer *list;
    Integer blk[MAXDIM], dims[MAXDIM], pe[MAXDIM], chunk[MAXDIM];
    Integer lo[MAXDIM], hi[MAXDIM], ld[MAXDIM];
    Integer *pmap[MAXDIM], *map;
    char *buf;
    if (GA[ga_handle].distr_type != REGULAR) {
      pnga_error("Block-cyclic arrays not supported for READ_ONLY",0);
    }
    if (GA[ga_handle].p_handle != pnga_pgroup_get_world()) {
      pnga_error("Arrays on subgroups not supported for READ_ONLY",0);
    }
    ndim = (int)GA[ga_handle].ndim;
    btot = 0;
    for (i=0; i<ndim; i++) {
      GA[ga_handle].old_nblock[i] = GA[ga_handle].nblock[i];
      GA[ga_handle].old_lo[i] = GA[ga_handle].lo[i];
      GA[ga_handle].old_chunk[i] = GA[ga_handle].chunk[i];
      btot += GA[ga_handle].nblock[i];
    }
    GA[ga_handle].old_mapc = (Integer*)malloc((btot+1)*sizeof(Integer));
    for (i=0; i<btot+1; i++) {
      GA[ga_handle].old_mapc[i] = GA[ga_handle].mapc[i];
    }
    /* Make a temporary copy of GA */
    g_tmp = pnga_create_handle();
    pnga_set_data(g_tmp,ndim,GA[ga_handle].dims,GA[ga_handle].type);
    pnga_set_pgroup(g_tmp,GA[ga_handle].p_handle);
    if (!pnga_allocate(g_tmp)) {
      pnga_error("Failed to allocate temporary array",0);
    }
    pnga_copy(g_a, g_tmp);
    /* Create a group containing all the processors on this node */
    GA[ga_handle].old_handle = GA[ga_handle].p_handle;
    nodeid = pnga_cluster_nodeid();
    nprocs = pnga_cluster_nprocs(nodeid);
    origin_id = pnga_cluster_procid(nodeid,0);
    dflt_grp = pnga_pgroup_get_default();
    pnga_pgroup_set_default(pnga_pgroup_get_world());
    list = (Integer*)malloc(nprocs*sizeof(Integer));
    for (i=0; i<nprocs; i++) {
      list[i] = origin_id+i;
    }
    handle = pnga_pgroup_create(list, nprocs);
    free(list);
    GA[ga_handle].p_handle = handle;
    GA[ga_handle].property = READ_ONLY;

    /* Ignore hints on data distribution (chunk) and just go with default
     * distribution on the node, except if chunk dimension is same as array
     * dimension (no partitioning on that axis) */
    for (i=0; i<ndim; i++) {
      /* eliminate dimension=1 from analysis, otherwise set blk to -1*/
      if (GA[ga_handle].chunk[i] == GA[ga_handle].dims[i]) {
        chunk[i] = GA[ga_handle].chunk[i];
      } else {
        chunk[i] = -1;
      }
      dims[i] = GA[ga_handle].dims[i];
    }
    if (chunk[0] != 0)
      for (d=0; d<ndim; d++) blk[d]=(Integer)GA_MIN(chunk[d],dims[d]);
    else
      for (d=0; d<ndim; d++) blk[d]=-1;
    for (d=0; d<ndim; d++) if (dims[d]==1) blk[d]=1;
    ddb_h2(ndim, dims, PGRP_LIST[handle].map_nproc,0.0,(Integer)0,blk,pe);
    for(d=0, map=mapALL; d< ndim; d++){
      Integer nblock;
      Integer pcut; /* # procs that get full blk[] elements; the rest gets less*/
      int p;

      pmap[d] = map;

      /* RJH ... don't leave some nodes without data if possible
       * but respect the users block size */

      if (chunk[d] > 1) {
        Integer ddim = ((dims[d]-1)/GA_MIN(chunk[d],dims[d]) + 1);
        pcut = (ddim -(blk[d]-1)*pe[d]) ;
      } else {
        pcut = (dims[d]-(blk[d]-1)*pe[d]) ;
      }

      for (nblock=i=p=0; (p<pe[d]) && (i<dims[d]); p++, nblock++) {
        Integer b = blk[d];
        if (p >= pcut)
          b = b-1;
        map[nblock] = i+1;
        if (chunk[d]>1) b *= GA_MIN(chunk[d],dims[d]);
        i += b;
      }

      pe[d] = GA_MIN(pe[d],nblock);
      map +=  pe[d];
    }
    maplen = 0;
    for( i = 0; i< ndim; i++){
      GA[ga_handle].nblock[i] = pe[i];
      maplen += pe[i];
    }
    free(GA[ga_handle].mapc);
    GA[ga_handle].mapc = (Integer*)malloc((maplen+1)*sizeof(Integer));
    for(i = 0; i< maplen; i++) {
      GA[ga_handle].mapc[i] = (C_Integer)mapALL[i];
    }
    GA[ga_handle].mapc[maplen] = -1;
    /* Set remaining paramters and determine memory size if regular data
     * distribution is being used */

    for( i = 0; i< ndim; i++){
      GA[ga_handle].scale[i] = (double)GA[ga_handle].nblock[i]
        / (double)GA[ga_handle].dims[i];
    }

    /*** determine which portion of the array I am supposed
     * to hold ***/
    pnga_distribution(g_a, GAme, GA[ga_handle].lo, hi);
    chk = 1;
    for( i = 0, nelem=1; i< ndim; i++){
      if (hi[i]-(Integer)GA[ga_handle].lo[i]+1 <= 0) chk = 0;
      nelem *= (hi[i]-(Integer)GA[ga_handle].lo[i]+1);
    }
    mem_size = nelem * GA[ga_handle].elemsize;
    if (!chk) mem_size = 0;
    grp_me = pnga_pgroup_nodeid(handle);
    /* Clean up old memory first */
#ifndef AVOID_MA_STORAGE
    if(gai_uses_shm((int)handle)){
#endif
      /* make sure that we free original (before address allignment)
       * pointer */
#ifdef MSG_COMMS_MPI
      if (GA[ga_handle].old_handle > 0){
        ARMCI_Free_group(
            GA[ga_handle].ptr[pnga_pgroup_nodeid(GA[ga_handle].old_handle)]
            - GA[ga_handle].id,
            &PGRP_LIST[GA[ga_handle].old_handle].group);
      }
      else
#endif
      {
        ARMCI_Free(
            GA[ga_handle].ptr[pnga_pgroup_nodeid(GA[ga_handle].old_handle)]
            - GA[ga_handle].id);
      }
#ifndef AVOID_MA_STORAGE
    }else{
      if(GA[ga_handle].id != INVALID_MA_HANDLE) MA_free_heap(GA[ga_handle].id);
    }
#endif

    if(GA_memory_limited) GA_total_memory += GA[ga_handle].size;
    GAstat.curmem -= GA[ga_handle].size;
    /* if requested, enforce limits on memory consumption */
    if(GA_memory_limited) GA_total_memory -= mem_size;
    GAstat.curmem += mem_size;
    /* check if everybody has enough memory left */
    if(GA_memory_limited){
      status = (GA_total_memory >= 0) ? 1 : 0;
      pnga_pgroup_gop(handle,pnga_type_f2c(MT_F_INT), &status, 1, "&&");
    } else status = 1;
    /* allocate memory */
    if (status) {
      /* Allocate new memory */
      if (GA[ga_handle].mem_dev_set) {
        status = !gai_get_devmem(GA[ga_handle].name, GA[ga_handle].ptr,mem_size,
            GA[ga_handle].type, &GA[ga_handle].id, handle,
            GA[ga_handle].mem_dev_set,GA[ga_handle].mem_dev);
      } else {
        status = !gai_getmem(GA[ga_handle].name, GA[ga_handle].ptr,mem_size,
            GA[ga_handle].type, &GA[ga_handle].id, handle);
      }
    } else {
      GA[ga_handle].ptr[grp_me]=NULL;
    }
    GA[ga_handle].size = (C_Long)mem_size;
    if (!status) {
      pnga_error("Memory failure when unsetting READ_ONLY",0);
    }
    /* Copy data from copy of old GA to new GA and then get rid of copy*/
    pnga_distribution(g_a,GAme,lo,hi);
    chk = 1;
    nelem = 1;
    for (i=0; i<ndim; i++) {
      /*
      GA[ga_handle].chunk[i] = ((C_Integer)hi[i]-GA[ga_handle].lo[i]+1);
      */
      ld[i] = hi[i] - lo[i] + 1;
      nelem *= ld[i];
      if (hi[i] < lo[i]) chk = 0;
    }
    if (chk) {
#if 1
      pnga_get(g_tmp,lo,hi,GA[ga_handle].ptr[grp_me],ld);
#else
      /* MPI RMA does not allow you to use memory assigned to one window as
       * local buffer for another buffer. Create a local buffer to get around
       * this problem */
      buf = (char*)malloc(nelem*GA[ga_handle].elemsize);
      pnga_get(g_tmp,lo,hi,buf,ld);
      memcpy(GA[ga_handle].ptr[grp_me],buf,nelem*GA[ga_handle].elemsize);
      free(buf);
#endif
    }
    pnga_destroy(g_tmp);
  } else if (strcmp(property, "read_cache") == 0) {
    GA[ga_handle].property = READ_CACHE;
    GA[ga_handle].cache_head = NULL; /* (cache_struct_t *)malloc(sizeof(cache_struct_t)) */
  } else {
    pnga_error("Trying to set unknown property",0);
  }
}